

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

void __thiscall
InlineeFrameRecord::Finalize(InlineeFrameRecord *this,Func *inlinee,uint32 currentOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint32 currentOffset_local;
  Func *inlinee_local;
  InlineeFrameRecord *this_local;
  
  PopulateParent(this,inlinee);
  this->inlineeStartOffset = currentOffset;
  this->inlineDepth = inlinee->inlineDepth;
  if (this->inlineDepth == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xce,"(this->inlineDepth != 0)","this->inlineDepth != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void InlineeFrameRecord::Finalize(Func* inlinee, uint32 currentOffset)
{
    this->PopulateParent(inlinee);
#if TARGET_32
    const uint32 offsetMask = (~(uint32)0) >> (sizeof(uint) * CHAR_BIT - Js::InlineeCallInfo::ksizeofInlineeStartOffset);
    AssertOrFailFast(currentOffset == (currentOffset & offsetMask));
#endif
    this->inlineeStartOffset = currentOffset;
    this->inlineDepth = inlinee->inlineDepth;

#ifdef MD_GROW_LOCALS_AREA_UP
    Func* topFunc = inlinee->GetTopFunc();
    int32 inlineeArgStackSize = topFunc->GetInlineeArgumentStackSize();
    int localsSize = topFunc->m_localStackHeight + topFunc->m_ArgumentsOffset;

    this->MapOffsets([=](int& offset)
    {
        int realOffset = -(offset + BailOutInfo::StackSymBias);
        if (realOffset < 0)
        {
            // Not stack offset
            return;
        }
        // The locals size contains the inlined-arg-area size, so remove the inlined-arg-area size from the
        // adjustment for normal locals whose offsets are relative to the start of the locals area.

        realOffset -= (localsSize - inlineeArgStackSize);
        offset = realOffset;
    });
#endif

    Assert(this->inlineDepth != 0);
}